

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::CloneVertexInterface
          (ProgramInterface *this,VaryingPassthrough *varying_passthrough)

{
  bool bVar1;
  Variable *pVVar2;
  reference ppVVar3;
  GLchar *pGVar4;
  GLchar *prefix_2;
  Variable *vs_var_2;
  size_t i_2;
  GLchar *prefix_1;
  Variable *vs_var_1;
  size_t i_1;
  GLchar *prefix;
  Variable *vs_var;
  size_t i;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *this_local;
  
  vs_var = (Variable *)0x0;
  while( true ) {
    pVVar2 = (Variable *)
             std::
             vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
             ::size(&(this->m_vertex).m_outputs);
    if (pVVar2 <= vs_var) break;
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[](&(this->m_vertex).m_outputs,(size_type)vs_var);
    pVVar2 = *ppVVar3;
    pGVar4 = GetStagePrefix(VERTEX,pVVar2->m_storage);
    cloneVariableForStage(this,pVVar2,TESS_CTRL,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,TESS_EVAL,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,GEOMETRY,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,FRAGMENT,pGVar4,varying_passthrough);
    vs_var = (Variable *)((long)&vs_var->m_data + 1);
  }
  vs_var_1 = (Variable *)0x0;
  while( true ) {
    pVVar2 = (Variable *)
             std::
             vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
             ::size(&(this->m_vertex).m_uniforms);
    if (pVVar2 <= vs_var_1) break;
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[](&(this->m_vertex).m_uniforms,(size_type)vs_var_1);
    pVVar2 = *ppVVar3;
    pGVar4 = GetStagePrefix(VERTEX,pVVar2->m_storage);
    cloneVariableForStage(this,pVVar2,COMPUTE,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,TESS_CTRL,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,TESS_EVAL,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,GEOMETRY,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,FRAGMENT,pGVar4,varying_passthrough);
    bVar1 = Utils::Variable::IsBlock(pVVar2);
    if (bVar1) {
      replaceBinding(this,pVVar2,VERTEX);
    }
    vs_var_1 = (Variable *)((long)&vs_var_1->m_data + 1);
  }
  vs_var_2 = (Variable *)0x0;
  while( true ) {
    pVVar2 = (Variable *)
             std::
             vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
             ::size(&(this->m_vertex).m_ssb_blocks);
    if (pVVar2 <= vs_var_2) break;
    ppVVar3 = std::
              vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ::operator[](&(this->m_vertex).m_ssb_blocks,(size_type)vs_var_2);
    pVVar2 = *ppVVar3;
    pGVar4 = GetStagePrefix(VERTEX,pVVar2->m_storage);
    cloneVariableForStage(this,pVVar2,COMPUTE,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,TESS_CTRL,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,TESS_EVAL,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,GEOMETRY,pGVar4,varying_passthrough);
    cloneVariableForStage(this,pVVar2,FRAGMENT,pGVar4,varying_passthrough);
    bVar1 = Utils::Variable::IsBlock(pVVar2);
    if (bVar1) {
      replaceBinding(this,pVVar2,VERTEX);
    }
    vs_var_2 = (Variable *)((long)&vs_var_2->m_data + 1);
  }
  std::__cxx11::string::operator=((string *)&this->m_compute,(string *)&this->m_vertex);
  std::__cxx11::string::operator=((string *)&this->m_fragment,(string *)&this->m_vertex);
  std::__cxx11::string::operator=((string *)&this->m_geometry,(string *)&this->m_vertex);
  std::__cxx11::string::operator=((string *)&this->m_tess_ctrl,(string *)&this->m_vertex);
  std::__cxx11::string::operator=((string *)&this->m_tess_eval,(string *)&this->m_vertex);
  return;
}

Assistant:

void ProgramInterface::CloneVertexInterface(VaryingPassthrough& varying_passthrough)
{
	/* VS outputs >> TCS inputs >> TCS outputs >> ..  >> FS inputs */
	for (size_t i = 0; i < m_vertex.m_outputs.size(); ++i)
	{
		const Variable& vs_var = *m_vertex.m_outputs[i];
		const GLchar*   prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);
	}

	/* Copy uniforms from VS to other stages */
	for (size_t i = 0; i < m_vertex.m_uniforms.size(); ++i)
	{
		Variable&	 vs_var = *m_vertex.m_uniforms[i];
		const GLchar* prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::COMPUTE, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);

		/* Uniform blocks needs unique binding */
		if (true == vs_var.IsBlock())
		{
			replaceBinding(vs_var, Shader::VERTEX);
		}
	}

	/* Copy SSBs from VS to other stages */
	for (size_t i = 0; i < m_vertex.m_ssb_blocks.size(); ++i)
	{
		Variable&	 vs_var = *m_vertex.m_ssb_blocks[i];
		const GLchar* prefix = GetStagePrefix(Shader::VERTEX, vs_var.m_storage);

		cloneVariableForStage(vs_var, Shader::COMPUTE, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_CTRL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::TESS_EVAL, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::GEOMETRY, prefix, varying_passthrough);
		cloneVariableForStage(vs_var, Shader::FRAGMENT, prefix, varying_passthrough);

		/* SSBs blocks needs unique binding */
		if (true == vs_var.IsBlock())
		{
			replaceBinding(vs_var, Shader::VERTEX);
		}
	}

	m_compute.m_globals   = m_vertex.m_globals;
	m_fragment.m_globals  = m_vertex.m_globals;
	m_geometry.m_globals  = m_vertex.m_globals;
	m_tess_ctrl.m_globals = m_vertex.m_globals;
	m_tess_eval.m_globals = m_vertex.m_globals;
}